

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall
qpdf::Stream::Stream
          (Stream *this,QPDF *qpdf,QPDFObjGen og,QPDFObjectHandle *stream_dict,qpdf_offset_t offset,
          size_t length)

{
  element_type *this_00;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  descr;
  undefined1 local_48 [24];
  size_t length_local;
  qpdf_offset_t offset_local;
  QPDFObjectHandle *stream_dict_local;
  QPDF *qpdf_local;
  Stream *this_local;
  QPDFObjGen og_local;
  
  local_48._16_8_ = length;
  length_local = offset;
  offset_local = (qpdf_offset_t)stream_dict;
  stream_dict_local = (QPDFObjectHandle *)qpdf;
  qpdf_local = (QPDF *)this;
  this_local = (Stream *)og;
  QPDFObject::create<QPDF_Stream,QPDFObjectHandle,unsigned_long&>
            ((QPDFObject *)local_48,qpdf,og,stream_dict,(unsigned_long *)(local_48 + 0x10));
  BaseHandle::BaseHandle(&this->super_BaseHandle,(shared_ptr<QPDFObject> *)local_48);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_48);
  QPDF::getFilename_abi_cxx11_(&local_d0,(QPDF *)stream_dict_local);
  std::operator+(&local_b0,&local_d0,", stream object ");
  QPDFObjGen::unparse_abi_cxx11_(&local_f0,(QPDFObjGen *)&this_local,' ');
  std::operator+(&local_90,&local_b0,&local_f0);
  std::
  make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       this);
  QPDFObject::setDescription
            (this_00,(QPDF *)stream_dict_local,
             (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
              *)local_70,length_local);
  setDictDescription(this);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                 *)local_70);
  return;
}

Assistant:

Stream::Stream(
    QPDF& qpdf, QPDFObjGen og, QPDFObjectHandle stream_dict, qpdf_offset_t offset, size_t length) :
    BaseHandle(QPDFObject::create<QPDF_Stream>(&qpdf, og, std::move(stream_dict), length))
{
    auto descr = std::make_shared<QPDFObject::Description>(
        qpdf.getFilename() + ", stream object " + og.unparse(' '));
    obj->setDescription(&qpdf, descr, offset);
    setDictDescription();
}